

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O2

bool __thiscall
TCLAP::SwitchArg::processArg
          (SwitchArg *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  CmdLineParseException *this_00;
  allocator local_61;
  string local_60;
  string local_40;
  
  if (((this->super_Arg)._ignoreable != true) || (Arg::ignoreRestRef()::ign == '\0')) {
    iVar2 = (*(this->super_Arg)._vptr_Arg[6])
                      (this,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + *i);
    if ((char)iVar2 != '\0') {
      commonProcessing(this);
      return true;
    }
    bVar1 = combinedSwitchesMatch
                      (this,(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + *i);
    if (bVar1) {
      bVar1 = combinedSwitchesMatch
                        (this,(args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + *i);
      if (bVar1) {
        this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
        std::__cxx11::string::string((string *)&local_40,"Argument already set!",&local_61);
        (*(this->super_Arg)._vptr_Arg[7])(&local_60,this);
        CmdLineParseException::CmdLineParseException(this_00,&local_40,&local_60);
        __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
      }
      commonProcessing(this);
      bVar1 = lastCombined(this,(args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + *i);
      return bVar1;
    }
  }
  return false;
}

Assistant:

inline bool SwitchArg::processArg(int *i, std::vector<std::string>& args)
{
	if ( _ignoreable && Arg::ignoreRest() )
		return false;

	// if the whole string matches the flag or name string
	if ( argMatches( args[*i] ) )
	{
		commonProcessing();

		return true;
	}
	// if a substring matches the flag as part of a combination
	else if ( combinedSwitchesMatch( args[*i] ) )
	{
		// check again to ensure we don't misinterpret 
		// this as a MultiSwitchArg 
		if ( combinedSwitchesMatch( args[*i] ) )
			throw(CmdLineParseException("Argument already set!", 
			                            toString()));

		commonProcessing();

		// We only want to return true if we've found the last combined
		// match in the string, otherwise we return true so that other 
		// switches in the combination will have a chance to match.
		return lastCombined( args[*i] );
	}
	else
		return false;
}